

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O2

bool __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::setEqual
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *to,Bucket *from)

{
  pointer ppVar1;
  pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_> *pair;
  size_t sVar2;
  pointer ppVar3;
  
  sVar2 = getBorderId(this,from);
  if (sVar2 != 0xffffffffffffffff) {
    ppVar1 = (this->borderBuckets).
             super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar3 = (this->borderBuckets).
                  super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1)
    {
      if (from->id == ((ppVar3->second)._M_data)->id) {
        (ppVar3->second)._M_data = to;
      }
    }
  }
  ValueRelations::areMerged(this->reported,to,from);
  Bucket::merge(to,from);
  erase(this,from);
  return true;
}

Assistant:

bool setEqual(Bucket &to, Bucket &from) {
        assert(to != from);
        if (getBorderId(from) != std::string::npos) {
            assert(getBorderId(to) ==
                   std::string::npos); // cannot merge two border buckets
            for (auto &pair : borderBuckets) {
                if (from == pair.second)
                    pair.second = to;
            }
        }
        reported.areMerged(to, from);
        to.merge(from);
        erase(from);
        return true;
    }